

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::UpdateArrayBailOutKind(BackwardPass *this,Instr *instr)

{
  OpCode OVar1;
  Opnd *pOVar2;
  RegOpnd *this_00;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  BailOutKind BVar6;
  BailOutKind BVar7;
  undefined8 in_RAX;
  undefined4 *puVar8;
  Instr *this_01;
  BVSparse<Memory::JitArenaAllocator> *pBVar9;
  IndirOpnd *pIVar10;
  undefined8 uStack_38;
  ValueType baseValueType;
  
  uStack_38 = in_RAX;
  if (this->currentPrePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1451,"(!IsPrePass())","!IsPrePass()");
    if (!bVar4) goto LAB_003e10cf;
    *puVar8 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1452,"(instr)","instr");
    if (!bVar4) goto LAB_003e10cf;
    *puVar8 = 0;
  }
  if ((instr->field_0x38 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1453,"(instr->HasBailOutInfo())","instr->HasBailOutInfo()");
    if (!bVar4) goto LAB_003e10cf;
    *puVar8 = 0;
  }
  OVar1 = instr->m_opcode;
  if (((1 < OVar1 - 0x203) && (OVar1 != StElemI_A_Strict)) && (OVar1 != StElemI_A)) {
    return;
  }
  OVar5 = IR::Opnd::GetKind(instr->m_dst);
  if (OVar5 != OpndKindIndir) {
    return;
  }
  pOVar2 = instr->m_dst;
  OVar5 = IR::Opnd::GetKind(pOVar2);
  if (OVar5 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar4) goto LAB_003e10cf;
    *puVar8 = 0;
  }
  this_00 = (RegOpnd *)pOVar2[1]._vptr_Opnd;
  uStack_38 = CONCAT26((this_00->super_Opnd).m_valueType.field_0.bits,(undefined6)uStack_38);
  bVar4 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)((long)&uStack_38 + 6));
  if (bVar4) {
    return;
  }
  pOVar2 = instr->m_dst;
  OVar5 = IR::Opnd::GetKind(pOVar2);
  if (OVar5 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar4) goto LAB_003e10cf;
    *puVar8 = 0;
  }
  *(undefined1 *)((long)&pOVar2[2]._vptr_Opnd + 5) = 1;
  bVar4 = ValueType::IsNotNativeArray((ValueType *)((long)&uStack_38 + 6));
  BVar7 = BailOutInvalid;
  BVar6 = BailOutInvalid;
  if (!bVar4) {
    pBVar9 = this->currentBlock->noImplicitCallNativeArrayUses;
    do {
      pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)pBVar9->head;
      BVar6 = BVar7;
      if (pBVar9 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003e0d92;
    } while (((Type *)&pBVar9->alloc)->word == 0);
    if ((pBVar9 != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
       (BVar7 = IR::Instr::GetBailOutKind(instr), (BVar7 >> 0x11 & 1) == 0)) {
      bVar4 = ValueType::IsLikelyNativeArray((ValueType *)((long)&uStack_38 + 6));
      BVar6 = BailOutConvertedNativeArray;
      if ((bVar4) && (instr->m_src1->m_type != TyVar)) {
        pIVar10 = IR::Opnd::AsIndirOpnd(instr->m_dst);
        pIVar10->m_conversionAllowed = false;
        BVar6 = BailOutInvalid;
      }
    }
  }
LAB_003e0d92:
  bVar4 = IR::RegOpnd::IsArrayRegOpnd(this_00);
  if (bVar4) {
    bVar4 = IR::RegOpnd::IsArrayRegOpnd(this_00);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
      if (!bVar4) goto LAB_003e10cf;
      *puVar8 = 0;
    }
    if (this_00[1].m_reg == RegRAX) {
      BVar7 = BVar6;
      if ((instr->field_0x37 & 0x10) != 0) {
        pBVar9 = this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses;
        do {
          pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)pBVar9->head;
          if (pBVar9 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003e0f70;
        } while (((Type *)&pBVar9->alloc)->word == 0);
        if (pBVar9 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003e0f70;
        this_01 = GlobOpt::FindUpperBoundsCheckInstr(this->globOpt,instr);
        if (this_01 == (Instr *)0x0 || this_01 == instr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1481,"(upperBoundCheck && upperBoundCheck != instr)",
                             "upperBoundCheck && upperBoundCheck != instr");
          if (!bVar4) goto LAB_003e10cf;
          *puVar8 = 0;
        }
        BVar6 = IR::Instr::GetBailOutKind(this_01);
        if (BVar6 == BailOutOnArrayAccessHelperCall) {
          IR::Instr::SetBailOutKind(this_01,BailOutOnInvalidatedArrayHeadSegment);
        }
        else {
          BVar6 = IR::Instr::GetBailOutKind(this_01);
          if (BVar6 != BailOutOnFailedHoistedBoundCheck) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x1489,
                               "(upperBoundCheck->GetBailOutKind() == IR::BailOutOnFailedHoistedBoundCheck)"
                               ,
                               "upperBoundCheck->GetBailOutKind() == IR::BailOutOnFailedHoistedBoundCheck"
                              );
            if (!bVar4) {
LAB_003e10cf:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar8 = 0;
          }
        }
      }
      goto LAB_003e0f70;
    }
  }
  pBVar9 = this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses;
  do {
    pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)pBVar9->head;
    if (pBVar9 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003e0f03;
  } while (((Type *)&pBVar9->alloc)->word == 0);
  if (pBVar9 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_003e0f03:
    pBVar9 = this->currentBlock->noImplicitCallNoMissingValuesUses;
    do {
      pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)pBVar9->head;
      if (pBVar9 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003e0f38;
    } while (((Type *)&pBVar9->alloc)->word == 0);
    if (pBVar9 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVar7 = IR::Instr::GetBailOutKind(instr);
      BVar6 = (BVar7 >> 3 & BailOutOnMissingValue | BVar6) ^ BailOutOnMissingValue;
    }
  }
  else {
    BVar6 = BVar6 | BailOutOnInvalidatedArrayHeadSegment;
  }
LAB_003e0f38:
  bVar4 = ValueType::IsNotArray((ValueType *)((long)&uStack_38 + 6));
  BVar7 = BVar6;
  if (!bVar4) {
    pBVar9 = this->currentBlock->noImplicitCallArrayLengthSymUses;
    do {
      pBVar9 = (BVSparse<Memory::JitArenaAllocator> *)pBVar9->head;
      if (pBVar9 == (BVSparse<Memory::JitArenaAllocator> *)0x0) break;
    } while (((Type *)&pBVar9->alloc)->word == 0);
    BVar7 = BVar6 + BailOutOnInvalidatedArrayLength;
    if (pBVar9 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVar7 = BVar6;
    }
  }
LAB_003e0f70:
  if (BVar7 != BailOutInvalid) {
    BVar6 = IR::Instr::GetBailOutKind(instr);
    IR::Instr::SetBailOutKind(instr,BVar7 | BVar6);
  }
  return;
}

Assistant:

void
BackwardPass::UpdateArrayBailOutKind(IR::Instr *const instr)
{
    Assert(!IsPrePass());
    Assert(instr);
    Assert(instr->HasBailOutInfo());

    if ((instr->m_opcode != Js::OpCode::StElemI_A && instr->m_opcode != Js::OpCode::StElemI_A_Strict &&
        instr->m_opcode != Js::OpCode::Memcopy && instr->m_opcode != Js::OpCode::Memset) ||
        !instr->GetDst()->IsIndirOpnd())
    {
        return;
    }

    IR::RegOpnd *const baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    if(baseValueType.IsNotArrayOrObjectWithArray())
    {
        return;
    }

    instr->GetDst()->AsIndirOpnd()->AllowConversion(true);
    IR::BailOutKind includeBailOutKinds = IR::BailOutInvalid;
    if (!baseValueType.IsNotNativeArray() &&
        !currentBlock->noImplicitCallNativeArrayUses->IsEmpty() &&
        !(instr->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall))
    {
        // There is an upwards-exposed use of a native array. Since the array referenced by this instruction can be aliased,
        // this instruction needs to bail out if it converts the native array even if this array specifically is not
        // upwards-exposed.
        if (!baseValueType.IsLikelyNativeArray() || instr->GetSrc1()->IsVar())
        {
            includeBailOutKinds |= IR::BailOutConvertedNativeArray;
        }
        else
        {
            // We are assuming that array conversion is impossible here, so make sure we execute code that fails if conversion does happen.
            instr->GetDst()->AsIndirOpnd()->AllowConversion(false);
        }
    }

    if(baseOpnd->IsArrayRegOpnd() && baseOpnd->AsArrayRegOpnd()->EliminatedUpperBoundCheck())
    {
        if(instr->extractedUpperBoundCheckWithoutHoisting && !currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty())
        {
            // See comment below regarding head segment invalidation. A failed upper bound check usually means that it will
            // invalidate the head segment length, so change the bailout kind on the upper bound check to have it bail out for
            // the right reason. Even though the store may actually occur in a non-head segment, which would not invalidate the
            // head segment or length, any store outside the head segment bounds causes head segment load elimination to be
            // turned off for the store, because the segment structure of the array is not guaranteed to be the same every time.
            IR::Instr *upperBoundCheck = this->globOpt->FindUpperBoundsCheckInstr(instr);
            Assert(upperBoundCheck && upperBoundCheck != instr);

            if(upperBoundCheck->GetBailOutKind() == IR::BailOutOnArrayAccessHelperCall)
            {
                upperBoundCheck->SetBailOutKind(IR::BailOutOnInvalidatedArrayHeadSegment);
            }
            else
            {
                Assert(upperBoundCheck->GetBailOutKind() == IR::BailOutOnFailedHoistedBoundCheck);
            }
        }
    }
    else
    {
        if(!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty())
        {
            // There is an upwards-exposed use of a segment sym. Since the head segment syms referenced by this instruction can
            // be aliased, this instruction needs to bail out if it changes the segment syms it references even if the ones it
            // references specifically are not upwards-exposed. This bailout kind also guarantees that this element store will
            // not create missing values.
            includeBailOutKinds |= IR::BailOutOnInvalidatedArrayHeadSegment;
        }
        else if(
            !currentBlock->noImplicitCallNoMissingValuesUses->IsEmpty() &&
            !(instr->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall))
        {
            // There is an upwards-exposed use of an array with no missing values. Since the array referenced by this
            // instruction can be aliased, this instruction needs to bail out if it creates a missing value in the array even if
            // this array specifically is not upwards-exposed.
            includeBailOutKinds |= IR::BailOutOnMissingValue;
        }

        if(!baseValueType.IsNotArray() && !currentBlock->noImplicitCallArrayLengthSymUses->IsEmpty())
        {
            // There is an upwards-exposed use of a length sym. Since the length sym referenced by this instruction can be
            // aliased, this instruction needs to bail out if it changes the length sym it references even if the ones it
            // references specifically are not upwards-exposed.
            includeBailOutKinds |= IR::BailOutOnInvalidatedArrayLength;
        }
    }

    if(!includeBailOutKinds)
    {
        return;
    }

    Assert(!(includeBailOutKinds & ~IR::BailOutKindBits));
    instr->SetBailOutKind(instr->GetBailOutKind() | includeBailOutKinds);
}